

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>,_-1,_1,_true>_>,_0,_0>
       ::run(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,__1,_1,_true>_>
             *mat,scalar_sum_op<double> *func)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  Scalar SVar5;
  
  lVar1 = (mat->m_rhs).
          super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,__1,_1,_true,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,__1,_1,_true,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,__1,_1,_true>,_0>
          .m_rows.m_value;
  if (0 < lVar1) {
    pdVar3 = (mat->m_lhs).m_matrix.
             super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_1,__1,_false>,_0>
             .m_data;
    pdVar2 = (mat->m_rhs).
             super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,__1,_1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,__1,_1,_true,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,__1,_1,_true>,_0>
             .m_data;
    SVar5 = *pdVar3 * *pdVar2;
    for (lVar4 = 1;
        pdVar3 = pdVar3 + *(Index *)((long)&(mat->m_lhs).m_matrix.
                                            super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_1,__1,_false,_Eigen::Dense>
                                            .
                                            super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_1,__1,_false,_true>
                                            .m_xpr.
                                            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false,_Eigen::Dense>
                                            .
                                            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false,_true>
                                    + 0x40), lVar1 != lVar4; lVar4 = lVar4 + 1) {
      SVar5 = SVar5 + *pdVar3 * pdVar2[lVar4];
    }
    return SVar5;
  }
  __assert_fail("mat.rows()>0 && mat.cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Redux.h"
                ,0xaf,
                "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, 2>, 1>>, const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>, -1, 1>, -1, 1, true>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<double>, Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, 2>, 1>>, const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>, -1, 1>, -1, 1, true>>, Traversal = 0, Unrolling = 0]"
               );
}

Assistant:

static EIGEN_STRONG_INLINE Scalar run(const Derived& mat, const Func& func)
  {
    eigen_assert(mat.rows()>0 && mat.cols()>0 && "you are using an empty matrix");
    Scalar res;
    res = mat.coeffByOuterInner(0, 0);
    for(Index i = 1; i < mat.innerSize(); ++i)
      res = func(res, mat.coeffByOuterInner(0, i));
    for(Index i = 1; i < mat.outerSize(); ++i)
      for(Index j = 0; j < mat.innerSize(); ++j)
        res = func(res, mat.coeffByOuterInner(i, j));
    return res;
  }